

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

void Vector3OrthoNormalize(Vector3 *v1,Vector3 *v2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  uVar1 = v1->x;
  uVar3 = v1->y;
  fVar12 = v1->z;
  fVar6 = SQRT(fVar12 * fVar12 + (float)uVar1 * (float)uVar1 + (float)uVar3 * (float)uVar3);
  uVar5 = -(uint)(fVar6 == 0.0);
  fVar6 = (float)(uVar5 & 0x3f800000 | ~uVar5 & (uint)(1.0 / fVar6));
  fVar7 = fVar6 * (float)uVar1;
  fVar8 = fVar6 * (float)uVar3;
  fVar6 = fVar6 * fVar12;
  v1->x = fVar7;
  v1->y = fVar8;
  v1->z = fVar6;
  uVar2 = v2->x;
  uVar4 = v2->y;
  fVar9 = fVar8 * v2->z - (float)uVar4 * fVar6;
  fVar10 = (float)uVar2 * fVar6 - v2->z * fVar7;
  fVar11 = (float)uVar4 * fVar7 - (float)uVar2 * fVar8;
  fVar12 = SQRT(fVar11 * fVar11 + fVar9 * fVar9 + fVar10 * fVar10);
  uVar5 = -(uint)(fVar12 == 0.0);
  fVar12 = (float)(uVar5 & 0x3f800000 | ~uVar5 & (uint)(1.0 / fVar12));
  v2->x = fVar6 * fVar12 * fVar10 + -fVar8 * fVar12 * fVar11;
  v2->y = fVar7 * fVar12 * fVar11 + -(fVar12 * fVar9) * fVar6;
  v2->z = fVar12 * fVar9 * fVar8 - fVar12 * fVar10 * fVar7;
  return;
}

Assistant:

RMDEF void Vector3OrthoNormalize(Vector3 *v1, Vector3 *v2)
{
    *v1 = Vector3Normalize(*v1);
    Vector3 vn = Vector3CrossProduct(*v1, *v2);
    vn = Vector3Normalize(vn);
    *v2 = Vector3CrossProduct(vn, *v1);
}